

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printOpenHeader(ConsoleReporter *this,string *_name)

{
  ulong in_RAX;
  ostream *poVar1;
  ulong uStack_18;
  Colour colourGuard;
  
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam0000000000210190 = 0x2d2d2d2d2d2d2d;
    uRam0000000000210197._0_1_ = '-';
    uRam0000000000210197._1_1_ = '-';
    uRam0000000000210197._2_1_ = '-';
    uRam0000000000210197._3_1_ = '-';
    uRam0000000000210197._4_1_ = '-';
    uRam0000000000210197._5_1_ = '-';
    uRam0000000000210197._6_1_ = '-';
    uRam0000000000210197._7_1_ = '-';
    DAT_00210180 = '-';
    DAT_00210180_1._0_1_ = '-';
    DAT_00210180_1._1_1_ = '-';
    DAT_00210180_1._2_1_ = '-';
    DAT_00210180_1._3_1_ = '-';
    DAT_00210180_1._4_1_ = '-';
    DAT_00210180_1._5_1_ = '-';
    DAT_00210180_1._6_1_ = '-';
    uRam0000000000210188 = 0x2d2d2d2d2d2d2d;
    DAT_0021018f = 0x2d;
    DAT_00210170 = '-';
    DAT_00210170_1._0_1_ = '-';
    DAT_00210170_1._1_1_ = '-';
    DAT_00210170_1._2_1_ = '-';
    DAT_00210170_1._3_1_ = '-';
    DAT_00210170_1._4_1_ = '-';
    DAT_00210170_1._5_1_ = '-';
    DAT_00210170_1._6_1_ = '-';
    uRam0000000000210178._0_1_ = '-';
    uRam0000000000210178._1_1_ = '-';
    uRam0000000000210178._2_1_ = '-';
    uRam0000000000210178._3_1_ = '-';
    uRam0000000000210178._4_1_ = '-';
    uRam0000000000210178._5_1_ = '-';
    uRam0000000000210178._6_1_ = '-';
    uRam0000000000210178._7_1_ = '-';
    DAT_00210160 = '-';
    DAT_00210160_1._0_1_ = '-';
    DAT_00210160_1._1_1_ = '-';
    DAT_00210160_1._2_1_ = '-';
    DAT_00210160_1._3_1_ = '-';
    DAT_00210160_1._4_1_ = '-';
    DAT_00210160_1._5_1_ = '-';
    DAT_00210160_1._6_1_ = '-';
    uRam0000000000210168._0_1_ = '-';
    uRam0000000000210168._1_1_ = '-';
    uRam0000000000210168._2_1_ = '-';
    uRam0000000000210168._3_1_ = '-';
    uRam0000000000210168._4_1_ = '-';
    uRam0000000000210168._5_1_ = '-';
    uRam0000000000210168._6_1_ = '-';
    uRam0000000000210168._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam0000000000210158._0_1_ = '-';
    uRam0000000000210158._1_1_ = '-';
    uRam0000000000210158._2_1_ = '-';
    uRam0000000000210158._3_1_ = '-';
    uRam0000000000210158._4_1_ = '-';
    uRam0000000000210158._5_1_ = '-';
    uRam0000000000210158._6_1_ = '-';
    uRam0000000000210158._7_1_ = '-';
    DAT_0021019f = 0;
  }
  uStack_18 = in_RAX;
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)45>()::line);
  std::operator<<(poVar1,'\n');
  uStack_18 = uStack_18 & 0xffffffffffffff;
  Colour::use(Headers);
  printHeaderString(this,_name,0);
  Colour::~Colour(&colourGuard);
  return;
}

Assistant:

void ConsoleReporter::printOpenHeader(std::string const& _name) {
    stream << getLineOfChars<'-'>() << '\n';
    {
        Colour colourGuard(Colour::Headers);
        printHeaderString(_name);
    }
}